

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void crec_fill(jit_State *J,TRef trdst,TRef trlen,TRef trfill,CTSize step)

{
  uint len_00;
  MSize MVar1;
  TRef TVar2;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  jit_State *in_RDI;
  CTSize len;
  MSize mlp;
  CRecMemList ml [16];
  undefined4 in_stack_fffffffffffffe68;
  TRef in_stack_fffffffffffffe6c;
  jit_State *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined2 in_stack_fffffffffffffe7c;
  IRRef1 in_stack_fffffffffffffe7e;
  jit_State *in_stack_fffffffffffffe80;
  CRecMemList local_168 [14];
  uint local_64;
  
  if ((in_EDX & 0xffff) < 0x8000) {
    len_00 = (in_RDI->cur).ir[in_EDX & 0xffff].field_1.op12;
    if (len_00 == 0) {
      return;
    }
    if ((len_00 < 0x81) && (MVar1 = crec_fill_unroll(local_168,len_00,8), MVar1 != 0)) {
      if (((in_ECX & 0xffff) < 0x8000) || (local_64 = in_ECX, local_168[0].tp != IRT_U8)) {
        (in_RDI->fold).ins.field_0.ot = 0x5913;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_ECX;
        (in_RDI->fold).ins.field_0.op2 = 0x270;
        local_64 = lj_opt_fold((jit_State *)
                               CONCAT26(in_stack_fffffffffffffe7e,
                                        CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78
                                                )));
      }
      if (local_168[0].tp != IRT_U8) {
        if (local_168[0].tp == IRT_U64) {
          if ((local_64 & 0xffff) < 0x8000) {
            (in_RDI->fold).ins.field_0.ot = 0x5916;
            (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_64;
            (in_RDI->fold).ins.field_0.op2 = 0x2d4;
            TVar2 = lj_opt_fold((jit_State *)
                                CONCAT26(in_stack_fffffffffffffe7e,
                                         CONCAT24(in_stack_fffffffffffffe7c,
                                                  in_stack_fffffffffffffe78)));
            local_64._0_2_ = (IRRef1)TVar2;
          }
          in_stack_fffffffffffffe80 = in_RDI;
          TVar2 = lj_ir_kint64(in_stack_fffffffffffffe70,
                               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          (in_stack_fffffffffffffe80->fold).ins.field_0.ot = 0x2b16;
          (in_stack_fffffffffffffe80->fold).ins.field_0.op1 = (IRRef1)local_64;
          (in_stack_fffffffffffffe80->fold).ins.field_0.op2 = (IRRef1)TVar2;
          lj_opt_fold((jit_State *)
                      CONCAT26(in_stack_fffffffffffffe7e,
                               CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)));
        }
        else {
          in_stack_fffffffffffffe70 = in_RDI;
          TVar2 = lj_ir_kint(in_stack_fffffffffffffe80,
                             CONCAT22((IRRef1)local_64,in_stack_fffffffffffffe7c));
          (in_stack_fffffffffffffe70->fold).ins.field_0.ot = 0x2b13;
          (in_stack_fffffffffffffe70->fold).ins.field_0.op1 = (IRRef1)local_64;
          (in_stack_fffffffffffffe70->fold).ins.field_0.op2 = (IRRef1)TVar2;
          lj_opt_fold((jit_State *)
                      CONCAT26((IRRef1)local_64,
                               CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)));
          in_stack_fffffffffffffe7e = (IRRef1)local_64;
        }
      }
      crec_fill_emit(in_stack_fffffffffffffe80,
                     (CRecMemList *)
                     CONCAT26(in_stack_fffffffffffffe7e,
                              CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)),
                     (MSize)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                     (TRef)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      goto LAB_001bb61c;
    }
  }
  lj_ir_call(in_RDI,IRCALL_memset,(ulong)in_ESI,(ulong)in_ECX,(ulong)in_EDX);
LAB_001bb61c:
  (in_RDI->fold).ins.field_0.ot = 0x5800;
  (in_RDI->fold).ins.field_0.op1 = 0;
  (in_RDI->fold).ins.field_0.op2 = 0;
  lj_opt_fold((jit_State *)
              CONCAT26(in_stack_fffffffffffffe7e,
                       CONCAT24(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)));
  return;
}

Assistant:

static void crec_fill(jit_State *J, TRef trdst, TRef trlen, TRef trfill,
		      CTSize step)
{
  if (tref_isk(trlen)) {  /* Length must be constant. */
    CRecMemList ml[CREC_FILL_MAXUNROLL];
    MSize mlp;
    CTSize len = (CTSize)IR(tref_ref(trlen))->i;
    if (len == 0) return;  /* Shortcut. */
    if (LJ_TARGET_UNALIGNED || step >= CTSIZE_PTR)
      step = CTSIZE_PTR;
    if (step * CREC_FILL_MAXUNROLL < len) goto fallback;
    mlp = crec_fill_unroll(ml, len, step);
    if (!mlp) goto fallback;
    if (tref_isk(trfill) || ml[0].tp != IRT_U8)
      trfill = emitconv(trfill, IRT_INT, IRT_U8, 0);
    if (ml[0].tp != IRT_U8) {  /* Scatter U8 to U16/U32/U64. */
      if (CTSIZE_PTR == 8 && ml[0].tp == IRT_U64) {
	if (tref_isk(trfill))  /* Pointless on x64 with zero-extended regs. */
	  trfill = emitconv(trfill, IRT_U64, IRT_U32, 0);
	trfill = emitir(IRT(IR_MUL, IRT_U64), trfill,
			lj_ir_kint64(J, U64x(01010101,01010101)));
      } else {
	trfill = emitir(IRTI(IR_MUL), trfill,
		   lj_ir_kint(J, ml[0].tp == IRT_U16 ? 0x0101 : 0x01010101));
      }
    }
    crec_fill_emit(J, ml, mlp, trdst, trfill);
  } else {
fallback:
    /* Call memset. Always needs a barrier to disable alias analysis. */
    lj_ir_call(J, IRCALL_memset, trdst, trfill, trlen);  /* Note: arg order! */
  }
  emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
}